

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O1

time_t cm_get_date(time_t now,char *p)

{
  token *ptVar1;
  int iVar2;
  ushort *puVar3;
  int iVar4;
  bool bVar5;
  byte bVar6;
  int Count;
  tm *ptVar7;
  ushort **ppuVar8;
  __int32_t **pp_Var9;
  size_t __n;
  size_t sVar10;
  ulong uVar11;
  long lVar12;
  time_t tVar13;
  time_t tVar14;
  DSTMODE DSTmode;
  int iVar15;
  long lVar16;
  ulong uVar17;
  int iVar18;
  token *ptVar19;
  ulong uVar20;
  int iVar21;
  char *__s;
  int iVar22;
  ulong uVar23;
  int iVar24;
  time_t tVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  token *ptVar29;
  token *ptVar30;
  time_t *ptVar31;
  ulong Day;
  time_t DayNumber;
  bool bVar32;
  int local_110c;
  int local_1108;
  int local_1104;
  ulong local_10f8;
  time_t local_10f0;
  byte *local_10e8;
  int local_10dc;
  long local_10d8;
  long local_10d0;
  int local_109c;
  time_t now_local;
  long local_1088;
  tm *local_1080;
  byte local_1078 [64];
  token tokens [256];
  
  now_local = now;
  memset(tokens,0,0x1000);
  ptVar7 = localtime(&now_local);
  if (ptVar7 == (tm *)0x0) {
    return -1;
  }
  local_109c = ptVar7->tm_sec;
  iVar18 = ptVar7->tm_min;
  iVar22 = ptVar7->tm_hour;
  iVar15 = ptVar7->tm_mday;
  iVar24 = ptVar7->tm_mon;
  iVar27 = ptVar7->tm_year;
  iVar21 = ptVar7->tm_yday;
  iVar26 = ptVar7->tm_isdst;
  local_1080 = gmtime(&now_local);
  if (local_1080 == (tm *)0x0) {
    lVar16 = 0;
  }
  else {
    iVar28 = local_1080->tm_year + 0x76b;
    iVar2 = iVar28 / 100;
    iVar4 = (iVar27 + 0x76b) / 100;
    lVar16 = ((long)local_1080->tm_min - (long)iVar18) * 0x3c +
             ((long)local_1080->tm_sec - (long)local_109c) +
             ((long)local_1080->tm_hour - (long)iVar22) * 0xe10 +
             (long)(((iVar4 + local_1080->tm_yday) -
                    ((iVar4 >> 2) + iVar21 + (iVar27 + 0x76b >> 2) + iVar2)) +
                   (local_1080->tm_year - iVar27) * 0x16d + (iVar28 >> 2) + (iVar2 >> 2)) * 0x15180;
  }
  local_1088 = lVar16 + 0xe10;
  if (iVar26 == 0) {
    local_1088 = lVar16;
  }
  ppuVar8 = __ctype_b_loc();
  puVar3 = *ppuVar8;
  uVar20 = 0;
  do {
    ptVar30 = (token *)((long)&tokens[0].token + uVar20);
    while( true ) {
      bVar6 = *p;
      while ((*(byte *)((long)puVar3 + (ulong)bVar6 * 2 + 1) & 0x20) != 0) {
        bVar6 = ((byte *)p)[1];
        p = (char *)((byte *)p + 1);
      }
      if (bVar6 != 0x28) break;
      iVar21 = 0;
      do {
        bVar6 = *p;
        if (bVar6 == 0x28) {
          iVar21 = iVar21 + 1;
        }
        else if (bVar6 == 0x29) {
          iVar21 = iVar21 + -1;
        }
        else if (bVar6 == 0) {
          p = (char *)((byte *)p + 1);
          local_1104 = 0;
          goto LAB_004400b7;
        }
        p = (char *)((byte *)p + 1);
      } while (0 < iVar21);
    }
    bVar6 = *p;
    local_10e8 = (byte *)p;
    if (bVar6 == 0) {
      uVar23 = 0;
    }
    else {
      uVar23 = 0;
      do {
        if ((((puVar3[bVar6] & 8) == 0) && (bVar6 != 0x2e)) || (0x3e < (uint)uVar23)) break;
        if (bVar6 != 0x2e) {
          if ((puVar3[bVar6] >> 8 & 1) != 0) {
            pp_Var9 = __ctype_tolower_loc();
            bVar6 = *(byte *)(*pp_Var9 + bVar6);
          }
          local_1078[uVar23] = bVar6;
          uVar23 = (ulong)((uint)uVar23 + 1);
        }
        bVar6 = local_10e8[1];
        local_10e8 = local_10e8 + 1;
      } while (bVar6 != 0);
    }
    local_1078[uVar23] = 0;
    __n = strlen((char *)local_1078);
    bVar32 = false;
    ptVar31 = &TimeWords[0].value;
    __s = "am";
    local_1104 = 0;
    do {
      sVar10 = ((LEXICON *)(ptVar31 + -3))->abbrev;
      if (sVar10 == 0) {
        sVar10 = strlen(__s);
      }
      bVar5 = true;
      if ((sVar10 <= __n) && (iVar21 = strncmp(__s,(char *)local_1078,__n), iVar21 == 0)) {
        *(time_t *)((long)&tokens[0].value + uVar20) = *ptVar31;
        local_1104 = *(int *)(ptVar31 + -1);
        bVar5 = false;
        p = (char *)local_10e8;
      }
      if (!bVar5) break;
      __s = (char *)ptVar31[2];
      ptVar31 = ptVar31 + 4;
      bVar32 = __s == (char *)0x0;
    } while (!bVar32);
    if (bVar32) {
      if ((*(byte *)((long)puVar3 + (ulong)(byte)*p * 2 + 1) & 8) == 0) {
        local_1104 = (int)*p;
        p = (char *)((byte *)p + 1);
      }
      else {
        *(undefined8 *)((long)&tokens[0].value + uVar20) = 0;
        uVar23 = (ulong)(byte)*p;
        local_1104 = 0x10b;
        if ((*(byte *)((long)puVar3 + uVar23 * 2 + 1) & 8) != 0) {
          lVar16 = 0;
          do {
            lVar16 = (long)(char)uVar23 + lVar16 * 10 + -0x30;
            *(long *)((long)&tokens[0].value + uVar20) = lVar16;
            uVar23 = (ulong)((byte *)p)[1];
            p = (char *)((byte *)p + 1);
          } while ((*(byte *)((long)puVar3 + uVar23 * 2 + 1) & 8) != 0);
        }
      }
    }
LAB_004400b7:
    ptVar19 = tokens;
    ptVar30->token = local_1104;
    if (local_1104 == 0) {
      iVar26 = 0;
      iVar28 = 0;
      local_110c = 0;
      local_10dc = 0;
      local_1104 = 0;
      iVar21 = 0;
      local_1108 = 0;
      lVar16 = 0;
      Day = 0;
      uVar20 = 0;
      local_10e8 = (byte *)0x0;
      local_10f8 = 0;
      local_10f0 = 0;
      uVar23 = 0;
      DSTmode = DSTon;
      tVar25 = 0;
      DayNumber = 0;
      local_10d8 = 0;
      local_10d0 = 0;
      break;
    }
    bVar32 = 0xfe0 < uVar20;
    uVar20 = uVar20 + 0x10;
    if (bVar32) {
      return -1;
    }
  } while( true );
LAB_004402f0:
  if (ptVar30 <= ptVar19) {
    if (iVar21 == 0) {
      DSTmode = DSTmaybe;
      lVar16 = local_1088;
    }
    if ((local_1080 != (tm *)0x0) && (iVar21 != 0)) {
      now_local = now_local - lVar16;
      ptVar7 = gmtime(&now_local);
      if (ptVar7 != (tm *)0x0) {
        local_109c = ptVar7->tm_sec;
        iVar18 = ptVar7->tm_min;
        iVar22 = ptVar7->tm_hour;
        iVar15 = ptVar7->tm_mday;
        iVar24 = ptVar7->tm_mon;
        iVar27 = ptVar7->tm_year;
      }
      now_local = now_local + lVar16;
    }
    if (iVar26 == 0) {
      uVar23 = (long)(iVar27 + 0x76c);
    }
    if (iVar28 == 0) {
      local_10f8 = (long)(iVar24 + 1);
    }
    if (local_110c == 0) {
      Day = (long)iVar15;
    }
    if (1 < local_1104) {
      return -1;
    }
    if (1 < iVar21) {
      return -1;
    }
    if (1 < local_10dc) {
      return -1;
    }
    if (1 < iVar26) {
      return -1;
    }
    if (1 < iVar28) {
      return -1;
    }
    if (1 < local_110c) {
      return -1;
    }
    if (((local_110c == 0 && local_10dc == 0) && (iVar28 == 0 && iVar26 == 0)) && local_1104 == 0) {
      tVar13 = now_local;
      if (local_1108 == 0) {
        tVar13 = now_local + (long)iVar22 * -0xe10 + ((long)iVar18 * -0x3c - (long)local_109c);
      }
    }
    else {
      tVar13 = Convert(local_10f8,Day,uVar23,uVar20,(time_t)local_10e8,local_10f0,lVar16,DSTmode);
      if (tVar13 < 0) {
        return -1;
      }
    }
    tVar14 = RelativeMonth(tVar13 + local_10d0,lVar16,local_10d8);
    lVar12 = tVar14 + tVar13 + local_10d0;
    if ((((local_10dc != 0) && (iVar26 == 0)) && (iVar28 == 0)) && (local_110c == 0)) {
      tVar25 = RelativeDate(lVar12,lVar16,DSTmode,tVar25,DayNumber);
      lVar12 = lVar12 + tVar25;
    }
    if (lVar12 != -1) {
      return lVar12;
    }
    return 0;
  }
  iVar2 = ptVar19->token;
  if (iVar2 == 0x10b) {
    ptVar29 = ptVar19 + 1;
    if (ptVar19[1].token == 0x107) {
      local_10e8 = (byte *)0x0;
LAB_004403e0:
      local_10f0 = 0;
    }
    else {
      if ((ptVar19[1].token != 0x3a) || (ptVar19[2].token != 0x10b)) goto LAB_004404cc;
      if ((ptVar19[3].token != 0x3a) || (ptVar19[4].token != 0x10b)) {
        local_10e8 = (byte *)ptVar19[2].value;
        ptVar29 = ptVar19 + 3;
        goto LAB_004403e0;
      }
      local_10e8 = (byte *)ptVar19[2].value;
      local_10f0 = ptVar19[4].value;
      ptVar29 = ptVar19 + 5;
    }
    uVar20 = ptVar19->value;
    if (ptVar29->token == 0x107) {
      uVar11 = 0;
      if (uVar20 != 0xc) {
        uVar11 = uVar20;
      }
      uVar20 = uVar11 + 0xc;
      if (ptVar29->value != 1) {
        uVar20 = uVar11;
      }
      ptVar29 = ptVar29 + 1;
    }
    if ((ptVar29->token == 0x2b) && (ptVar29[1].token == 0x10b)) {
      iVar21 = iVar21 + 1;
      lVar16 = ptVar29[1].value * -0x3c + (ptVar29[1].value / 100) * 0x960;
      ptVar29 = ptVar29 + 2;
      DSTmode = DSToff;
    }
    local_1104 = local_1104 + 1;
    ptVar19 = ptVar29;
    if ((ptVar29->token == 0x2d) && (ptVar29[1].token == 0x10b)) {
      lVar16 = ptVar29[1].value * 0x3c + (ptVar29[1].value / 100) * -0x960;
      ptVar29 = ptVar29 + 2;
LAB_0044050c:
      iVar21 = iVar21 + 1;
      DSTmode = DSToff;
      ptVar19 = ptVar29;
    }
LAB_0044052e:
    bVar32 = false;
  }
  else {
LAB_004404cc:
    if (iVar2 == 0x106) {
      iVar21 = iVar21 + 1;
      lVar16 = ptVar19->value;
      ptVar19 = ptVar19 + 1;
      DSTmode = DSTon;
      goto LAB_0044052e;
    }
    if (iVar2 == 0x10c) {
      ptVar29 = ptVar19 + 1;
      if (ptVar19[1].token != 0x10d) {
        lVar16 = ptVar19->value;
        goto LAB_0044050c;
      }
      iVar21 = iVar21 + 1;
      lVar16 = ptVar19->value;
      DSTmode = DSTon;
      ptVar19 = ptVar29;
      goto LAB_0044052e;
    }
    if (iVar2 != 0x10b) {
LAB_00440659:
      if ((iVar2 == 0x108) && (ptVar19[1].token == 0x10b)) {
        if ((ptVar19[2].token == 0x2c) && (ptVar19[3].token == 0x10b)) {
          iVar26 = iVar26 + 1;
          iVar28 = iVar28 + 1;
          local_110c = local_110c + 1;
          local_10f8 = ptVar19->value;
          Day = ptVar19[1].value;
          uVar23 = ptVar19[3].value;
          ptVar19 = ptVar19 + 4;
          goto LAB_0044072b;
        }
        iVar28 = iVar28 + 1;
        local_110c = local_110c + 1;
        local_10f8 = ptVar19->value;
        Day = ptVar19[1].value;
        ptVar19 = ptVar19 + 2;
      }
      else if ((iVar2 == 0x10b) && (ptVar19[1].token == 0x108)) {
        if (ptVar19[2].token == 0x10b) {
          iVar26 = iVar26 + 1;
          iVar28 = iVar28 + 1;
          local_110c = local_110c + 1;
          Day = ptVar19->value;
          local_10f8 = ptVar19[1].value;
          uVar23 = ptVar19[2].value;
          ptVar19 = ptVar19 + 3;
          goto LAB_0044072b;
        }
        iVar28 = iVar28 + 1;
        local_110c = local_110c + 1;
        Day = ptVar19->value;
        local_10f8 = ptVar19[1].value;
        ptVar19 = ptVar19 + 2;
      }
      else {
        if (iVar2 == 0x10b) {
          if (ptVar19[1].token == 0x105) {
            local_10dc = local_10dc + 1;
            tVar25 = ptVar19->value;
            DayNumber = ptVar19[1].value;
            ptVar19 = ptVar19 + 2;
            goto LAB_0044072b;
          }
        }
        else if (iVar2 == 0x105) {
          local_10dc = local_10dc + 1;
          DayNumber = ptVar19->value;
          ptVar29 = ptVar19 + 2;
          ptVar1 = ptVar19 + 1;
          ptVar19 = ptVar19 + 1;
          if (ptVar1->token == 0x2c) {
            ptVar19 = ptVar29;
          }
          tVar25 = 1;
          goto LAB_0044052e;
        }
        if (((iVar2 == 0x2d) && (ptVar19[1].token == 0x10b)) && (ptVar19[2].token == 0x10a)) {
          local_10d0 = local_10d0 - ptVar19[2].value * ptVar19[1].value;
LAB_0044082a:
          ptVar19 = ptVar19 + 3;
LAB_004408ab:
          local_1108 = local_1108 + 1;
          bVar32 = false;
        }
        else {
          if (((iVar2 == 0x2b) && (ptVar19[1].token == 0x10b)) && (ptVar19[2].token == 0x10a)) {
            local_10d0 = local_10d0 + ptVar19[2].value * ptVar19[1].value;
            goto LAB_0044082a;
          }
          if ((iVar2 == 0x10b) && (ptVar19[1].token == 0x10a)) {
            local_10d0 = local_10d0 + ptVar19[1].value * ptVar19->value;
LAB_00440852:
            ptVar19 = ptVar19 + 2;
            goto LAB_004408ab;
          }
          if (((iVar2 == 0x2d) && (ptVar19[1].token == 0x10b)) && (ptVar19[2].token == 0x109)) {
            local_10d8 = local_10d8 - ptVar19[2].value * ptVar19[1].value;
            goto LAB_0044082a;
          }
          if (((iVar2 == 0x2b) && (ptVar19[1].token == 0x10b)) && (ptVar19[2].token == 0x109)) {
            local_10d8 = local_10d8 + ptVar19[2].value * ptVar19[1].value;
            goto LAB_0044082a;
          }
          if ((iVar2 == 0x10b) && (ptVar19[1].token == 0x109)) {
            local_10d8 = local_10d8 + ptVar19[1].value * ptVar19->value;
            goto LAB_00440852;
          }
          if (iVar2 == 0x109) {
            local_10d8 = local_10d8 + ptVar19->value;
LAB_004408a3:
            ptVar19 = ptVar19 + 1;
            goto LAB_004408ab;
          }
          bVar32 = true;
          if (iVar2 == 0x10a) {
            local_10d0 = local_10d0 + ptVar19->value;
            goto LAB_004408a3;
          }
        }
        if (bVar32) {
          bVar32 = true;
          if (ptVar19->token == 0x10b) {
            uVar11 = ptVar19->value;
            if (((local_1104 == 0) || (iVar26 != 0)) || (local_1108 != 0)) {
              if (10000 < (long)uVar11) {
                iVar26 = iVar26 + 1;
                iVar28 = iVar28 + 1;
                local_110c = local_110c + 1;
                Day = uVar11 % 100;
                local_10f8 = (uVar11 / 100) % 100;
                uVar23 = uVar11 / 10000;
                goto LAB_00440905;
              }
              if ((long)uVar11 < 0x18) {
                local_1104 = local_1104 + 1;
                ptVar19 = ptVar19 + 1;
                local_10e8 = (byte *)0x0;
                local_10f0 = 0;
                uVar20 = uVar11;
                goto LAB_0044052e;
              }
              uVar17 = uVar11 % 100;
              bVar32 = 0x3b < uVar17 || 0x95f < uVar11;
              if (0x3b >= uVar17 && 0x95f >= uVar11) {
                ptVar19 = ptVar19 + 1;
                local_10f0 = 0;
                uVar20 = uVar11 / 100;
                local_10e8 = (byte *)uVar17;
              }
            }
            else {
              ptVar19 = ptVar19 + 1;
              iVar26 = 1;
              bVar32 = false;
              uVar23 = uVar11;
            }
          }
          goto LAB_00440531;
        }
        if (ptVar19->token == 0x104) {
          local_10d0 = -local_10d0;
          local_10d8 = -local_10d8;
LAB_00440905:
          ptVar19 = ptVar19 + 1;
        }
      }
      goto LAB_0044052e;
    }
    if (ptVar19[1].token != 0x2d) {
      if ((ptVar19[1].token != 0x2f) || (ptVar19[2].token != 0x10b)) goto LAB_00440659;
      if ((ptVar19[3].token != 0x2f) || (ptVar19[4].token != 0x10b)) {
        iVar28 = iVar28 + 1;
        local_110c = local_110c + 1;
        local_10f8 = ptVar19->value;
        Day = ptVar19[2].value;
        ptVar19 = ptVar19 + 3;
        goto LAB_0044052e;
      }
      local_10f8 = ptVar19->value;
      if ((long)local_10f8 < 0xd) {
        uVar23 = ptVar19[4].value;
        lVar12 = 0x28;
        uVar11 = local_10f8;
        if ((0xc < (long)uVar23) || (Day = ptVar19[2].value, 0xc < (long)Day)) goto LAB_00440a53;
      }
      else {
        lVar12 = 0x48;
        uVar11 = ptVar19[2].value;
        uVar23 = local_10f8;
LAB_00440a53:
        Day = *(ulong *)((long)&ptVar19->token + lVar12);
        local_10f8 = uVar11;
      }
      iVar26 = iVar26 + 1;
      iVar28 = iVar28 + 1;
      local_110c = local_110c + 1;
      ptVar19 = ptVar19 + 5;
      goto LAB_0044052e;
    }
    if (ptVar19[2].token == 0x108) {
      if ((ptVar19[3].token != 0x2d) || (ptVar19[4].token != 0x10b)) goto LAB_00440659;
      Day = ptVar19->value;
      uVar23 = ptVar19[4].value;
      if (0x1f < (long)Day) {
        uVar23 = Day;
        Day = ptVar19[4].value;
      }
      local_10f8 = ptVar19[2].value;
    }
    else {
      if (((ptVar19[2].token != 0x10b) || (ptVar19[3].token != 0x2d)) || (ptVar19[4].token != 0x10b)
         ) goto LAB_00440659;
      uVar23 = ptVar19->value;
      local_10f8 = ptVar19[2].value;
      Day = ptVar19[4].value;
    }
    local_110c = local_110c + 1;
    iVar26 = iVar26 + 1;
    iVar28 = iVar28 + 1;
    ptVar19 = ptVar19 + 5;
LAB_0044072b:
    bVar32 = false;
  }
LAB_00440531:
  if (bVar32) {
    return -1;
  }
  goto LAB_004402f0;
}

Assistant:

time_t
__archive_get_date(time_t now, const char *p)
{
	struct token	tokens[256];
	struct gdstate	_gds;
	struct token	*lasttoken;
	struct gdstate	*gds;
	struct tm	local, *tm;
	struct tm	gmt, *gmt_ptr;
	time_t		Start;
	time_t		tod;
	long		tzone;

	/* Clear out the parsed token array. */
	memset(tokens, 0, sizeof(tokens));
	/* Initialize the parser state. */
	memset(&_gds, 0, sizeof(_gds));
	gds = &_gds;

	/* Look up the current time. */
	memset(&local, 0, sizeof(local));
	tm = localtime (&now);
	if (tm == NULL)
		return -1;
	local = *tm;

	/* Look up UTC if we can and use that to determine the current
	 * timezone offset. */
	memset(&gmt, 0, sizeof(gmt));
	gmt_ptr = gmtime (&now);
	if (gmt_ptr != NULL) {
		/* Copy, in case localtime and gmtime use the same buffer. */
		gmt = *gmt_ptr;
	}
	if (gmt_ptr != NULL)
		tzone = difftm (&gmt, &local);
	else
		/* This system doesn't understand timezones; fake it. */
		tzone = 0;
	if(local.tm_isdst)
		tzone += HOUR;

	/* Tokenize the input string. */
	lasttoken = tokens;
	while ((lasttoken->token = nexttoken(&p, &lasttoken->value)) != 0) {
		++lasttoken;
		if (lasttoken > tokens + 255)
			return -1;
	}
	gds->tokenp = tokens;

	/* Match phrases until we run out of input tokens. */
	while (gds->tokenp < lasttoken) {
		if (!phrase(gds))
			return -1;
	}

	/* Use current local timezone if none was specified. */
	if (!gds->HaveZone) {
		gds->Timezone = tzone;
		gds->DSTmode = DSTmaybe;
	}

	/* If a timezone was specified, use that for generating the default
	 * time components instead of the local timezone. */
	if (gds->HaveZone && gmt_ptr != NULL) {
		now -= gds->Timezone;
		gmt_ptr = gmtime (&now);
		if (gmt_ptr != NULL)
			local = *gmt_ptr;
		now += gds->Timezone;
	}

	if (!gds->HaveYear)
		gds->Year = local.tm_year + 1900;
	if (!gds->HaveMonth)
		gds->Month = local.tm_mon + 1;
	if (!gds->HaveDay)
		gds->Day = local.tm_mday;
	/* Note: No default for hour/min/sec; a specifier that just
	 * gives date always refers to 00:00 on that date. */

	/* If we saw more than one time, timezone, weekday, year, month,
	 * or day, then give up. */
	if (gds->HaveTime > 1 || gds->HaveZone > 1 || gds->HaveWeekDay > 1
	    || gds->HaveYear > 1 || gds->HaveMonth > 1 || gds->HaveDay > 1)
		return -1;

	/* Compute an absolute time based on whatever absolute information
	 * we collected. */
	if (gds->HaveYear || gds->HaveMonth || gds->HaveDay
	    || gds->HaveTime || gds->HaveWeekDay) {
		Start = Convert(gds->Month, gds->Day, gds->Year,
		    gds->Hour, gds->Minutes, gds->Seconds,
		    gds->Timezone, gds->DSTmode);
		if (Start < 0)
			return -1;
	} else {
		Start = now;
		if (!gds->HaveRel)
			Start -= local.tm_hour * HOUR + local.tm_min * MINUTE
			    + local.tm_sec;
	}

	/* Add the relative offset. */
	Start += gds->RelSeconds;
	Start += RelativeMonth(Start, gds->Timezone, gds->RelMonth);

	/* Adjust for day-of-week offsets. */
	if (gds->HaveWeekDay
	    && !(gds->HaveYear || gds->HaveMonth || gds->HaveDay)) {
		tod = RelativeDate(Start, gds->Timezone,
		    gds->DSTmode, gds->DayOrdinal, gds->DayNumber);
		Start += tod;
	}

	/* -1 is an error indicator, so return 0 instead of -1 if
	 * that's the actual time. */
	return Start == -1 ? 0 : Start;
}